

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_function.cpp
# Opt level: O2

string * __thiscall
duckdb::PragmaFunction::ToString_abi_cxx11_(string *__return_storage_ptr__,PragmaFunction *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *this_00;
  allocator local_91;
  string local_90;
  string local_70 [32];
  string local_50;
  string local_30 [32];
  
  if (this->type == PRAGMA_CALL) {
    ::std::__cxx11::string::string(local_70,"PRAGMA %s",&local_91);
    SimpleNamedParameterFunction::ToString_abi_cxx11_
              (&local_90,&this->super_SimpleNamedParameterFunction);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_70,&local_90,in_RCX);
    ::std::__cxx11::string::~string((string *)&local_90);
    this_00 = local_70;
  }
  else {
    if (this->type != PRAGMA_STATEMENT) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_91);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string(local_30,"PRAGMA %s",&local_91);
    ::std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               &(this->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name)
    ;
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_30,&local_50,in_RCX);
    ::std::__cxx11::string::~string((string *)&local_50);
    this_00 = local_30;
  }
  ::std::__cxx11::string::~string(this_00);
  return __return_storage_ptr__;
}

Assistant:

string PragmaFunction::ToString() const {
	switch (type) {
	case PragmaType::PRAGMA_STATEMENT:
		return StringUtil::Format("PRAGMA %s", name);
	case PragmaType::PRAGMA_CALL: {
		return StringUtil::Format("PRAGMA %s", SimpleNamedParameterFunction::ToString());
	}
	default:
		return "UNKNOWN";
	}
}